

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_widget.c
# Opt level: O2

void text_widget_layer_update(ugui_layer_t *layer,void *graphics_ctx,void *layer_ctx)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ugui_rect_t *puVar5;
  size_t sVar6;
  uint uVar7;
  ugui_point_t point;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  char local_a8 [8];
  uint8_t line_buff [64];
  ugui_size_t local_40;
  uint local_3c;
  ugui_size_t text_size;
  ulong uVar11;
  
  line_buff._56_8_ = graphics_ctx;
  puVar5 = ugui_layer_get_bounds(layer);
  ugui_font_get_text_size(*(font_style_t **)((long)layer_ctx + 8),"A",&local_40);
  uVar2 = puVar5->h;
  uVar4 = (uint)puVar5->w / (uint)local_40.w;
  uVar3 = (uint)local_40.h;
  sVar6 = strlen(*(char **)((long)layer_ctx + 0x18));
  uVar7 = 0;
  text_size.w = 0;
  text_size.h = 0;
  uVar13 = 0;
  local_3c = 0;
  do {
    uVar10 = uVar7 & 0xffff;
    uVar11 = (ulong)uVar10;
    if ((((uint)sVar6 & 0xffff) <= uVar10) || (uVar9 = local_3c & 0xffff, uVar2 / uVar3 <= uVar9)) {
      return;
    }
    uVar8 = 0;
LAB_00105413:
    uVar12 = (uint)uVar13;
    if (((ushort)uVar4 <= uVar8) ||
       (uVar12 = (uint)sVar6 - uVar7, (uVar11 - (sVar6 & 0xffff)) + uVar8 == 0)) goto LAB_00105447;
    cVar1 = *(char *)(uVar8 + *(long *)((long)layer_ctx + 0x18) + uVar11);
    if (cVar1 == ' ') {
      uVar13 = uVar8 & 0xffffffff;
LAB_0010543a:
      uVar8 = uVar8 + 1;
      goto LAB_00105413;
    }
    if (cVar1 != '\n') goto LAB_0010543a;
    uVar12 = (uint)uVar8;
LAB_00105447:
    uVar7 = uVar12 & 0xffff;
    strncpy(local_a8,(char *)(*(long *)((long)layer_ctx + 0x18) + uVar11),(ulong)uVar7);
    local_a8[uVar7] = '\0';
    cVar1 = *(char *)((long)layer_ctx + 0x10);
    if (cVar1 == '\x02') {
      text_size = (ugui_size_t)(uVar4 - uVar12);
    }
    else if (cVar1 == '\x01') {
      text_size = (ugui_size_t)((int)(uVar4 - uVar7) / 2);
    }
    else if (cVar1 == '\0') {
      text_size.w = 0;
      text_size.h = 0;
    }
    uVar13 = (ulong)uVar12;
    point.x = local_40.w * text_size.w;
    point.y = (short)local_3c * local_40.h;
    ugui_graphics_draw_text
              ((ugui_graphics_t *)line_buff._56_8_,local_a8,*(font_style_t **)((long)layer_ctx + 8),
               point);
    uVar7 = uVar10 + uVar7 + 1;
    local_3c = uVar9 + 1;
  } while( true );
}

Assistant:

static void text_widget_layer_update(ugui_layer_t* layer, void* graphics_ctx, void* layer_ctx)
{
    ugui_text_widget_t* text_widget = (ugui_text_widget_t*) layer_ctx;
    ugui_rect_t* bounds = ugui_layer_get_bounds(layer);

    uint8_t line_buff[64];

    ugui_size_t text_size;
    // TODO: dirty hack will only support monospace fonts
    ugui_font_get_text_size(text_widget->font,
                            "A",
                            &text_size);

    uint16_t max_text_width = bounds->w / text_size.w;
    uint16_t max_text_lines = bounds->h / text_size.h;

    uint16_t len = strlen(text_widget->text);

    uint16_t line_index = 0;
    uint16_t line_count = 0;
    uint16_t offset = 0;
    uint16_t alignment_offset = 0;

    while ((offset < len) && (line_index < max_text_lines)) {

        // Determine line length
        for (int i = 0; i < max_text_width; i++) {
            // Handle end of text
            if ((offset + i) >= len) {
                line_count = i;
                break;
            }

            // Handle newlines
            if (text_widget->text[offset + i] == '\n') {
                line_count = i;
                break;
            }

            // Insert linebreaks up to spaces.
            if (text_widget->text[offset + i] == ' ') {
                line_count = i;
            }
        }

        // Copy line into line buffer for rendering
        strncpy(line_buff, text_widget->text + offset, line_count);
        line_buff[line_count] = '\0';

        // Calculate offset for alignment modes
        switch (text_widget->alignment) {
        case UGUI_TEXT_ALIGN_LEFT:
            alignment_offset = 0;
            break;
        case UGUI_TEXT_ALIGN_CENTER:
            alignment_offset = (max_text_width - line_count) / 2;
            break;
        case UGUI_TEXT_ALIGN_RIGHT:
            alignment_offset = (max_text_width - line_count);
            break;
        }

        ugui_graphics_draw_text(graphics_ctx,
                                line_buff,
                                text_widget->font,
        (ugui_point_t) {
            .x = alignment_offset * text_size.w, .y = line_index * text_size.h
        });

        offset += line_count + 1;
        line_index += 1;
    }
}